

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.cpp
# Opt level: O3

header_info *
anon_unknown.dwarf_194423::sec_websocket_key
          (header_info *__return_storage_ptr__,header_info *hi,string *value)

{
  bool bVar1;
  type *ptVar2;
  
  pstore::maybe<std::__cxx11::string,void>::operator=
            ((maybe<std::__cxx11::string,void> *)&hi->websocket_key,value);
  bVar1 = hi->connection_upgrade;
  __return_storage_ptr__->upgrade_to_websocket = hi->upgrade_to_websocket;
  __return_storage_ptr__->connection_upgrade = bVar1;
  pstore::
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  maybe(&__return_storage_ptr__->websocket_key,&hi->websocket_key);
  (__return_storage_ptr__->websocket_version).valid_ = false;
  if ((hi->websocket_version).valid_ == true) {
    ptVar2 = (type *)pstore::maybe<unsigned_int,_void>::operator->(&hi->websocket_version);
    (__return_storage_ptr__->websocket_version).storage_ = *ptVar2;
    (__return_storage_ptr__->websocket_version).valid_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

header_info sec_websocket_key (header_info hi, std::string const & value) {
        hi.websocket_key = value;
        return hi;
    }